

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O2

void __thiscall BaseTest::solve<PrimMST<BinaryHeap,false>>(BaseTest *this,char *info)

{
  ostream *poVar1;
  long lVar2;
  double dVar3;
  rep time;
  double ans;
  PrimMST<BinaryHeap,_false> solver;
  long local_48;
  double local_40;
  char *local_38;
  _Vector_base<Point2d,_std::allocator<Point2d>_> local_30;
  
  local_38 = info;
  poVar1 = std::operator<<((ostream *)&std::cout,info);
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = std::chrono::_V2::system_clock::now();
  std::vector<Point2d,_std::allocator<Point2d>_>::vector
            ((vector<Point2d,_std::allocator<Point2d>_> *)&local_30,&this->input);
  dVar3 = PrimMST<BinaryHeap,_false>::operator()((PrimMST<BinaryHeap,_false> *)&local_30);
  local_40 = dVar3;
  local_48 = std::chrono::_V2::system_clock::now();
  local_48 = local_48 - lVar2;
  poVar1 = std::operator<<((ostream *)&std::cout,"use time : ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"result : ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<BaseTest::Result,std::allocator<BaseTest::Result>>::
  emplace_back<char_const*&,double&,long&>
            ((vector<BaseTest::Result,std::allocator<BaseTest::Result>> *)&this->results,&local_38,
             &local_40,&local_48);
  std::_Vector_base<Point2d,_std::allocator<Point2d>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void BaseTest::solve(const char *info)
{
	std::cout << info << std::endl;
	auto beg = now();
	MSTSolver solver(input);
	double ans = solver();
	auto time = (now() - beg).count();
	std::cout << "use time : " << time << std::endl
	          << "result : " << ans << std::endl
	          << std::endl;
	results.emplace_back(info, ans, time);
}